

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

M44d * Imath_3_2::procrustesRotationAndTranslation<float>
                 (Vec3<float> *A,Vec3<float> *B,float *weights,size_t numPoints,bool doScale)

{
  double *pdVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  Matrix44<double> *in_RDI;
  ulong in_R8;
  byte in_R9B;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  V3d translate;
  int j;
  int i_6;
  KahanSum traceBATQ;
  size_t i_5;
  size_t i_4;
  KahanSum traceATA;
  double s;
  M33d Qt;
  V3d S;
  M33d V;
  M33d U;
  double w_1;
  size_t i_3;
  size_t i_2;
  M33d C;
  double w;
  size_t i_1;
  size_t i;
  double weightsSum;
  V3d Bcenter;
  V3d Acenter;
  Vec3<double> *in_stack_fffffffffffffa90;
  Vec3<double> *in_stack_fffffffffffffa98;
  Matrix33<double> *in_stack_fffffffffffffaa0;
  Vec3<double> *in_stack_fffffffffffffaa8;
  undefined8 in_stack_fffffffffffffac8;
  undefined1 forcePositiveDeterminant;
  double in_stack_fffffffffffffad0;
  Matrix33<double> *in_stack_fffffffffffffad8;
  Vec3<double> *in_stack_fffffffffffffae0;
  Matrix33<double> *in_stack_fffffffffffffae8;
  Matrix33<double> *in_stack_fffffffffffffaf0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  int local_4b0;
  int local_4ac;
  KahanSum local_4a8;
  Vec3<double> local_498 [2];
  ulong local_468;
  Vec3<double> local_460 [2];
  ulong local_430;
  KahanSum local_428;
  double local_418;
  Matrix33<double> local_3c8;
  Vec3<double> local_380;
  Matrix33<double> local_368;
  Matrix33<double> local_320;
  Vec3<double> local_2d8 [2];
  Vec3<double> local_2a8 [3];
  Matrix33<double> local_260;
  Vec3<double> *local_218;
  ulong local_210;
  Vec3<double> local_208 [2];
  Vec3<double> local_1d8 [2];
  Matrix33<double> local_1a8;
  ulong local_160;
  Matrix33<double> local_158;
  Vec3<double> local_110;
  Vec3<double> local_f8;
  Vec3<double> local_e0;
  Vec3<double> local_c8;
  Matrix33<double> *local_b0;
  ulong local_a8;
  Vec3<double> local_a0;
  Vec3<double> local_88;
  ulong local_70;
  double local_68;
  Vec3<double> local_60;
  Vec3<double> local_48;
  byte local_29;
  ulong local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_29 = in_R9B & 1;
  if (in_R8 == 0) {
    Matrix44<double>::Matrix44(in_RDI);
  }
  else {
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    Vec3<double>::Vec3(&local_48,0.0);
    Vec3<double>::Vec3(&local_60,0.0);
    local_68 = 0.0;
    if (local_20 == 0) {
      for (local_70 = 0; local_70 < local_28; local_70 = local_70 + 1) {
        Vec3<double>::Vec3<float>(&local_88,(Vec3<float> *)(local_10 + local_70 * 0xc));
        Vec3<double>::operator+=(&local_48,&local_88);
        Vec3<double>::Vec3<float>(&local_a0,(Vec3<float> *)(local_18 + local_70 * 0xc));
        Vec3<double>::operator+=(&local_60,&local_a0);
      }
      auVar4._8_4_ = (int)(local_28 >> 0x20);
      auVar4._0_8_ = local_28;
      auVar4._12_4_ = 0x45300000;
      local_68 = (auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_28) - 4503599627370496.0);
    }
    else {
      for (local_a8 = 0; local_a8 < local_28; local_a8 = local_a8 + 1) {
        in_stack_fffffffffffffae8 = (Matrix33<double> *)(double)*(float *)(local_20 + local_a8 * 4);
        local_68 = (double)in_stack_fffffffffffffae8 + local_68;
        local_b0 = in_stack_fffffffffffffae8;
        Vec3<double>::Vec3<float>(&local_e0,(Vec3<float> *)(local_10 + local_a8 * 0xc));
        operator*((double)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
        Vec3<double>::operator+=(&local_48,&local_c8);
        in_stack_fffffffffffffaf0 = local_b0;
        Vec3<double>::Vec3<float>(&local_110,(Vec3<float> *)(local_18 + local_a8 * 0xc));
        operator*((double)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
        Vec3<double>::operator+=(&local_60,&local_f8);
      }
    }
    if ((local_68 != 0.0) || (NAN(local_68))) {
      Vec3<double>::operator/=(&local_48,local_68);
      Vec3<double>::operator/=(&local_60,local_68);
      Matrix33<double>::Matrix33(&local_158,0.0);
      if (local_20 == 0) {
        for (local_160 = 0;
            forcePositiveDeterminant = (undefined1)((ulong)in_stack_fffffffffffffac8 >> 0x38),
            local_160 < local_28; local_160 = local_160 + 1) {
          Vec3<double>::Vec3<float>(local_1d8,(Vec3<float> *)(local_18 + local_160 * 0xc));
          Vec3<double>::operator-(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
          Vec3<double>::Vec3<float>(local_208,(Vec3<float> *)(local_10 + local_160 * 0xc));
          Vec3<double>::operator-(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
          outerProduct<double>(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
          Matrix33<double>::operator+=(&local_158,&local_1a8);
        }
      }
      else {
        for (local_210 = 0;
            forcePositiveDeterminant = (undefined1)((ulong)in_stack_fffffffffffffac8 >> 0x38),
            local_210 < local_28; local_210 = local_210 + 1) {
          in_stack_fffffffffffffae0 = (Vec3<double> *)(double)*(float *)(local_20 + local_210 * 4);
          local_218 = in_stack_fffffffffffffae0;
          Vec3<double>::Vec3<float>(local_2a8,(Vec3<float> *)(local_18 + local_210 * 0xc));
          Vec3<double>::operator-(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
          operator*((double)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
          Vec3<double>::Vec3<float>(local_2d8,(Vec3<float> *)(local_10 + local_210 * 0xc));
          Vec3<double>::operator-(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
          outerProduct<double>(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
          Matrix33<double>::operator+=(&local_158,&local_260);
        }
      }
      Matrix33<double>::Matrix33(&local_320);
      Matrix33<double>::Matrix33(&local_368);
      Vec3<double>::Vec3(&local_380);
      std::numeric_limits<double>::epsilon();
      jacobiSVD<double>(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                        in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                        in_stack_fffffffffffffad0,(bool)forcePositiveDeterminant);
      Matrix33<double>::transposed((Matrix33<double> *)in_stack_fffffffffffffa98);
      Matrix33<double>::operator*
                ((Matrix33<double> *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      local_418 = 1.0;
      if (((local_29 & 1) != 0) && (1 < local_28)) {
        anon_unknown_20::KahanSum::KahanSum(&local_428);
        if (local_20 == 0) {
          for (local_430 = 0; local_430 < local_28; local_430 = local_430 + 1) {
            Vec3<double>::Vec3<float>(local_460,(Vec3<float> *)(local_10 + local_430 * 0xc));
            Vec3<double>::operator-(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
            dVar2 = Vec3<double>::length2((Vec3<double> *)0x112f36);
            anon_unknown_20::KahanSum::operator+=(&local_428,dVar2);
          }
        }
        else {
          for (local_468 = 0; local_468 < local_28; local_468 = local_468 + 1) {
            dVar2 = (double)*(float *)(local_20 + local_468 * 4);
            Vec3<double>::Vec3<float>(local_498,(Vec3<float> *)(local_10 + local_468 * 0xc));
            Vec3<double>::operator-(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
            dVar3 = Vec3<double>::length2((Vec3<double> *)0x112fea);
            anon_unknown_20::KahanSum::operator+=(&local_428,dVar2 * dVar3);
          }
        }
        anon_unknown_20::KahanSum::KahanSum(&local_4a8);
        for (local_4ac = 0; local_4ac < 3; local_4ac = local_4ac + 1) {
          for (local_4b0 = 0; local_4b0 < 3; local_4b0 = local_4b0 + 1) {
            pdVar1 = Matrix33<double>::operator[](&local_3c8,local_4b0);
            dVar2 = pdVar1[local_4ac];
            pdVar1 = Matrix33<double>::operator[](&local_158,local_4ac);
            anon_unknown_20::KahanSum::operator+=(&local_4a8,dVar2 * pdVar1[local_4b0]);
          }
        }
        dVar2 = anon_unknown_20::KahanSum::get(&local_4a8);
        local_418 = anon_unknown_20::KahanSum::get(&local_428);
        local_418 = dVar2 / local_418;
      }
      operator*((double)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      operator*(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      Vec3<double>::operator-(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      Matrix44<double>::Matrix44
                (in_RDI,local_418 * local_3c8.x[0][0],local_418 * local_3c8.x[0][1],
                 local_418 * local_3c8.x[0][2],0.0,local_418 * local_3c8.x[1][0],
                 local_418 * local_3c8.x[1][1],local_418 * local_3c8.x[1][2],0.0,
                 local_418 * local_3c8.x[2][0],local_418 * local_3c8.x[2][1],
                 local_418 * local_3c8.x[2][2],0.0,local_4c8,local_4c0,local_4b8,1.0);
    }
    else {
      Matrix44<double>::Matrix44(in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

M44d
procrustesRotationAndTranslation (
    const Vec3<T>* A,
    const Vec3<T>* B,
    const T*       weights,
    const size_t   numPoints,
    const bool     doScale)
{
    if (numPoints == 0) return M44d ();

    // Always do the accumulation in double precision:
    V3d    Acenter (0.0);
    V3d    Bcenter (0.0);
    double weightsSum = 0.0;

    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            Acenter += (V3d) A[i];
            Bcenter += (V3d) B[i];
        }
        weightsSum = (double) numPoints;
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            weightsSum += w;

            Acenter += w * (V3d) A[i];
            Bcenter += w * (V3d) B[i];
        }
    }

    if (weightsSum == 0) return M44d ();

    Acenter /= weightsSum;
    Bcenter /= weightsSum;

    //
    // Find Q such that |Q*A - B|  (actually A-Acenter and B-Bcenter, weighted)
    // is minimized in the least squares sense.
    // From Golub/Van Loan, p.601
    //
    // A,B are 3xn
    // Let C = B A^T   (where A is 3xn and B^T is nx3, so C is 3x3)
    // Compute the SVD: C = U D V^T  (U,V rotations, D diagonal).
    // Throw away the D part, and return Q = U V^T
    M33d C (0.0);
    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
            C += outerProduct ((V3d) B[i] - Bcenter, (V3d) A[i] - Acenter);
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            C +=
                outerProduct (w * ((V3d) B[i] - Bcenter), (V3d) A[i] - Acenter);
        }
    }

    M33d U, V;
    V3d  S;
    jacobiSVD (C, U, S, V, std::numeric_limits<double>::epsilon (), true);

    // We want Q.transposed() here since we are going to be using it in the
    // Imath style (multiplying vectors on the right, v' = v*A^T):
    const M33d Qt = V * U.transposed ();

    double s = 1.0;
    if (doScale && numPoints > 1)
    {
        // Finding a uniform scale: let us assume the Q is completely fixed
        // at this point (solving for both simultaneously seems much harder).
        // We are trying to compute (again, per Golub and van Loan)
        //    min || s*A*Q - B ||_F
        // Notice that we've jammed a uniform scale in front of the Q.
        // Now, the Frobenius norm (the least squares norm over matrices)
        // has the neat property that it is equivalent to minimizing the trace
        // of M^T*M (see your friendly neighborhood linear algebra text for a
        // derivation).  Thus, we can expand this out as
        //   min tr (s*A*Q - B)^T*(s*A*Q - B)
        // = min tr(Q^T*A^T*s*s*A*Q) + tr(B^T*B) - 2*tr(Q^T*A^T*s*B)  by linearity of the trace
        // = min s^2 tr(A^T*A) + tr(B^T*B) - 2*s*tr(Q^T*A^T*B)        using the fact that the trace is invariant
        //                                                            under similarity transforms Q*M*Q^T
        // If we differentiate w.r.t. s and set this to 0, we get
        // 0 = 2*s*tr(A^T*A) - 2*tr(Q^T*A^T*B)
        // so
        // 2*s*tr(A^T*A) = 2*s*tr(Q^T*A^T*B)
        // s = tr(Q^T*A^T*B) / tr(A^T*A)

        KahanSum traceATA;
        if (weights == 0)
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA += ((V3d) A[i] - Acenter).length2 ();
        }
        else
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA +=
                    ((double) weights[i]) * ((V3d) A[i] - Acenter).length2 ();
        }

        KahanSum traceBATQ;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                traceBATQ += Qt[j][i] * C[i][j];

        s = traceBATQ.get () / traceATA.get ();
    }

    // Q is the rotation part of what we want to return.
    // The entire transform is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin)
    //                last                                first
    // The effect of this on a point is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin) * point
    //  = (translate origin to Bcenter) * Q * (-Acenter + point)
    //  = (translate origin to Bcenter) * (-Q*Acenter + Q*point)
    //  = (translate origin to Bcenter) * (translate Q*Acenter to origin) * Q*point
    //  = (translate Q*Acenter to Bcenter) * Q*point
    // So what we want to return is:
    //    (translate Q*Acenter to Bcenter) * Q
    //
    // In block form, this is:
    //   [ 1 0 0  | ] [       0 ] [ 1 0 0  |  ]   [ 1 0 0  | ] [           |   ]   [                 ]
    //   [ 0 1 0 tb ] [  s*Q  0 ] [ 0 1 0 -ta ] = [ 0 1 0 tb ] [  s*Q  -s*Q*ta ] = [   Q   tb-s*Q*ta ]
    //   [ 0 0 1  | ] [       0 ] [ 0 0 1  |  ]   [ 0 0 1  | ] [           |   ]   [                 ]
    //   [ 0 0 0  1 ] [ 0 0 0 1 ] [ 0 0 0  1  ]   [ 0 0 0  1 ] [ 0 0 0     1   ]   [ 0 0 0    1      ]
    // (ofc the whole thing is transposed for Imath).
    const V3d translate = Bcenter - s * Acenter * Qt;

    return M44d (
        s * Qt.x[0][0],
        s * Qt.x[0][1],
        s * Qt.x[0][2],
        T (0),
        s * Qt.x[1][0],
        s * Qt.x[1][1],
        s * Qt.x[1][2],
        T (0),
        s * Qt.x[2][0],
        s * Qt.x[2][1],
        s * Qt.x[2][2],
        T (0),
        translate.x,
        translate.y,
        translate.z,
        T (1));
}